

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateAnimMesh.cpp
# Opt level: O2

aiAnimMesh * Assimp::aiCreateAnimMesh(aiMesh *mesh)

{
  char *pcVar1;
  uint uVar2;
  aiVector3D *paVar3;
  void *pvVar4;
  aiAnimMesh *this;
  ulong uVar5;
  aiVector3D *paVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  
  this = (aiAnimMesh *)operator_new(0x4b0);
  aiAnimMesh::aiAnimMesh(this);
  uVar5 = (ulong)mesh->mNumVertices;
  this->mNumVertices = mesh->mNumVertices;
  paVar3 = mesh->mVertices;
  if (paVar3 != (aiVector3D *)0x0) {
    uVar9 = uVar5 * 0xc;
    paVar6 = (aiVector3D *)operator_new__(uVar9);
    if (uVar5 != 0) {
      memset(paVar6,0,((uVar9 - 0xc) - (uVar9 - 0xc) % 0xc) + 0xc);
    }
    this->mVertices = paVar6;
    memcpy(paVar6,paVar3,uVar9);
  }
  paVar3 = mesh->mNormals;
  if (paVar3 != (aiVector3D *)0x0) {
    uVar9 = uVar5 * 0xc;
    paVar6 = (aiVector3D *)operator_new__(uVar9);
    if (uVar5 != 0) {
      memset(paVar6,0,((uVar9 - 0xc) - (uVar9 - 0xc) % 0xc) + 0xc);
    }
    this->mNormals = paVar6;
    memcpy(paVar6,paVar3,uVar9);
  }
  paVar3 = mesh->mTangents;
  if (paVar3 != (aiVector3D *)0x0) {
    uVar9 = uVar5 * 0xc;
    paVar6 = (aiVector3D *)operator_new__(uVar9);
    if (uVar5 != 0) {
      memset(paVar6,0,((uVar9 - 0xc) - (uVar9 - 0xc) % 0xc) + 0xc);
    }
    this->mTangents = paVar6;
    memcpy(paVar6,paVar3,uVar9);
  }
  paVar3 = mesh->mBitangents;
  if (paVar3 != (aiVector3D *)0x0) {
    uVar9 = uVar5 * 0xc;
    paVar6 = (aiVector3D *)operator_new__(uVar9);
    if (uVar5 != 0) {
      memset(paVar6,0,((uVar9 - 0xc) - (uVar9 - 0xc) % 0xc) + 0xc);
    }
    this->mBitangents = paVar6;
    memcpy(paVar6,paVar3,uVar9);
  }
  for (lVar8 = 0x85; lVar8 != 0x8d; lVar8 = lVar8 + 1) {
    pvVar4 = *(void **)((long)mesh + lVar8 * 8 + -0x3f8);
    if (pvVar4 == (void *)0x0) {
      pcVar1 = (this->mName).data + lVar8 * 8 + -4;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    else {
      uVar2 = this->mNumVertices;
      uVar9 = (ulong)uVar2 << 4;
      pvVar7 = operator_new__(uVar9);
      if ((ulong)uVar2 != 0) {
        memset(pvVar7,0,uVar9);
      }
      *(void **)((this->mName).data + lVar8 * 8 + -4) = pvVar7;
      memcpy(pvVar7,pvVar4,uVar5 << 4);
    }
  }
  for (lVar8 = 0x8d; lVar8 != 0x95; lVar8 = lVar8 + 1) {
    pvVar4 = *(void **)((long)mesh + lVar8 * 8 + -0x3f8);
    if (pvVar4 == (void *)0x0) {
      pcVar1 = (this->mName).data + lVar8 * 8 + -4;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    else {
      uVar2 = this->mNumVertices;
      uVar9 = (ulong)uVar2 * 0xc;
      pvVar7 = operator_new__(uVar9);
      if ((ulong)uVar2 != 0) {
        uVar9 = uVar9 - 0xc;
        memset(pvVar7,0,(uVar9 - uVar9 % 0xc) + 0xc);
      }
      *(void **)((this->mName).data + lVar8 * 8 + -4) = pvVar7;
      memcpy(pvVar7,pvVar4,uVar5 * 0xc);
    }
  }
  return this;
}

Assistant:

aiAnimMesh *aiCreateAnimMesh(const aiMesh *mesh)
{
    aiAnimMesh *animesh = new aiAnimMesh;
    animesh->mNumVertices = mesh->mNumVertices;
    if (mesh->mVertices) {
        animesh->mVertices = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mVertices, mesh->mVertices, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mNormals) {
        animesh->mNormals = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mNormals, mesh->mNormals, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mTangents) {
        animesh->mTangents = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mTangents, mesh->mTangents, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mBitangents) {
        animesh->mBitangents = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mBitangents, mesh->mBitangents, mesh->mNumVertices * sizeof(aiVector3D));
    }

    for (int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
        if (mesh->mColors[i]) {
            animesh->mColors[i] = new aiColor4D[animesh->mNumVertices];
            std::memcpy(animesh->mColors[i], mesh->mColors[i], mesh->mNumVertices * sizeof(aiColor4D));
        } else {
            animesh->mColors[i] = NULL;
        }
    }

    for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        if (mesh->mTextureCoords[i]) {
            animesh->mTextureCoords[i] = new aiVector3D[animesh->mNumVertices];
            std::memcpy(animesh->mTextureCoords[i], mesh->mTextureCoords[i], mesh->mNumVertices * sizeof(aiVector3D));
        } else {
            animesh->mTextureCoords[i] = NULL;
        }
    }
    return animesh;
}